

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

SymbolEntry *
ActionConstantPtr::isPointer
          (AddrSpace *spc,Varnode *vn,PcodeOp *op,int4 slot,Address *rampoint,uintb *fullEncoding,
          Funcdata *data)

{
  Architecture *spc_00;
  bool bVar1;
  int4 iVar2;
  SymbolEntry *pSVar3;
  AddrSpace *local_40;
  pointer local_38;
  
  spc_00 = data->glb;
  if (vn->type->metatype == TYPE_PTR) {
    AddrSpaceManager::resolveConstant
              ((AddrSpaceManager *)&stack0xffffffffffffffc0,(AddrSpace *)spc_00,(uintb)spc,
               (int4)(vn->loc).offset,(Address *)(ulong)(uint)vn->size,(uintb *)&op->start);
    rampoint->base = local_40;
    rampoint->offset = (uintb)local_38;
    bVar1 = false;
  }
  else {
    if ((vn->flags & 0x100) != 0) {
      return (SymbolEntry *)0x0;
    }
    bVar1 = true;
    switch(op->opcode->opcode) {
    case CPUI_COPY:
    case CPUI_INT_EQUAL:
    case CPUI_INT_NOTEQUAL:
    case CPUI_INT_LESS:
    case CPUI_INT_LESSEQUAL:
      break;
    default:
      return (SymbolEntry *)0x0;
    case CPUI_STORE:
      if (slot != 2) {
        return (SymbolEntry *)0x0;
      }
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
    case CPUI_RETURN:
      if (slot == 0) {
        return (SymbolEntry *)0x0;
      }
      if (spc_00->infer_pointers == false) {
        return (SymbolEntry *)0x0;
      }
      break;
    case CPUI_INT_ADD:
      if (op->output->type->metatype == TYPE_PTR) {
        bVar1 = false;
        if ((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start[1 - slot]->type->metatype == TYPE_PTR) {
          return (SymbolEntry *)0x0;
        }
      }
      else if (spc_00->infer_pointers == false) {
        return (SymbolEntry *)0x0;
      }
    }
    if ((spc_00->pointer_lowerbound != 0) && ((vn->loc).offset < spc_00->pointer_lowerbound)) {
      return (SymbolEntry *)0x0;
    }
    iVar2 = bit_transitions((vn->loc).offset,vn->size);
    if (iVar2 < 3) {
      return (SymbolEntry *)0x0;
    }
    AddrSpaceManager::resolveConstant
              ((AddrSpaceManager *)&stack0xffffffffffffffc0,(AddrSpace *)spc_00,(uintb)spc,
               (int4)(vn->loc).offset,(Address *)(ulong)(uint)vn->size,(uintb *)&op->start);
    rampoint->base = local_40;
    rampoint->offset = (uintb)local_38;
  }
  if (rampoint->base == (AddrSpace *)0x0) {
    return (SymbolEntry *)0x0;
  }
  local_40 = (AddrSpace *)0x0;
  pSVar3 = Scope::queryContainer
                     ((data->localmap->super_ScopeInternal).super_Scope.parent,rampoint,1,
                      (Address *)&stack0xffffffffffffffc0);
  if (bVar1 && pSVar3 != (SymbolEntry *)0x0) {
    if ((pSVar3->addr).base != rampoint->base) {
      return (SymbolEntry *)0x0;
    }
    if ((pSVar3->addr).offset != rampoint->offset) {
      return (SymbolEntry *)0x0;
    }
  }
  return pSVar3;
}

Assistant:

SymbolEntry *ActionConstantPtr::isPointer(AddrSpace *spc,Varnode *vn,PcodeOp *op,int4 slot,
					  Address &rampoint,uintb &fullEncoding,Funcdata &data)

{
  bool needexacthit;
  Architecture *glb = data.getArch();
  Varnode *outvn;
  if (vn->getType()->getMetatype() == TYPE_PTR) { // Are we explicitly marked as a pointer
    rampoint = glb->resolveConstant(spc,vn->getOffset(),vn->getSize(),op->getAddr(),fullEncoding);
    needexacthit = false;
  }
  else {
    if (vn->isTypeLock()) return (SymbolEntry *)0; // Locked as NOT a pointer
    needexacthit = true;
    // Check if the constant is involved in a potential pointer expression
    // as the base
    switch(op->code()) {
    case CPUI_RETURN:
    case CPUI_CALL:
    case CPUI_CALLIND:
      // A constant parameter or return value could be a pointer
      if (!glb->infer_pointers)
	return (SymbolEntry *)0;
      if (slot==0)
	return (SymbolEntry *)0;
      break;
    case CPUI_COPY:
    case CPUI_INT_EQUAL:
    case CPUI_INT_NOTEQUAL:
    case CPUI_INT_LESS:
    case CPUI_INT_LESSEQUAL:
      // A comparison with a constant could be a pointer
      break;
    case CPUI_INT_ADD:
      outvn = op->getOut();
      if (outvn->getType()->getMetatype()==TYPE_PTR) {
	// Is there another pointer base in this expression
	if (op->getIn(1-slot)->getType()->getMetatype()==TYPE_PTR)
	  return (SymbolEntry *)0; // If so, we are not a pointer
	// FIXME: need to fully explore additive tree
	needexacthit = false;
      }
      else if (!glb->infer_pointers)
	return (SymbolEntry *)0;
      break;
    case CPUI_STORE:
      if (slot != 2)
	return (SymbolEntry *)0;
      break;
    default:
      return (SymbolEntry *)0;
    }
    // Make sure the constant is in the expected range for a pointer
    if ((glb->pointer_lowerbound != 0)&&(glb->pointer_lowerbound > vn->getOffset()))
      return (SymbolEntry *)0;
    // Check if the constant looks like a single bit or mask
    if (bit_transitions(vn->getOffset(),vn->getSize()) < 3)
      return (SymbolEntry *)0;
    rampoint = glb->resolveConstant(spc,vn->getOffset(),vn->getSize(),op->getAddr(),fullEncoding);
  }

  if (rampoint.isInvalid()) return (SymbolEntry *)0;
    // Since we are looking for a global address
    // Assume it is address tied and use empty usepoint
  SymbolEntry *entry = data.getScopeLocal()->getParent()->queryContainer(rampoint,1,Address());
  if (needexacthit&&(entry != (SymbolEntry *)0)) {
    if (entry->getAddr() != rampoint)
      return (SymbolEntry *)0;
  }
  return entry;
}